

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parsePrimitiveArrayHexTest_Test::
~OpenDDLParserTest_parsePrimitiveArrayHexTest_Test
          (OpenDDLParserTest_parsePrimitiveArrayHexTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018aff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parsePrimitiveArrayHexTest) {
    size_t len(0);
    char token[] =
            "{0x01,0x02,0x03}\n";
    char *end(findEnd(token, len));
    Value *data(nullptr);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    char *in = OpenDDLParser::parseDataList(token, end, type, &data, numValues, &refs, numRefs);
    EXPECT_NE(in, token);
    registerValueForDeletion(data);
}